

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetFloatValue(MapValueRef *this,float value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  LogFinisher local_5d [13];
  LogMessage local_50;
  float local_14;
  MapValueRef *pMStack_10;
  float value_local;
  MapValueRef *this_local;
  
  local_14 = value;
  pMStack_10 = this;
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 != CPPTYPE_FLOAT) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x32b);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueRef::SetFloatValue");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pcVar3 = FieldDescriptor::CppTypeName(CPPTYPE_FLOAT);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,pcVar3);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
    pcVar3 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,pcVar3);
    internal::LogFinisher::operator=(local_5d,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  *(float *)(this->super_MapValueConstRef).data_ = local_14;
  return;
}

Assistant:

void SetFloatValue(float value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_FLOAT, "MapValueRef::SetFloatValue");
    *reinterpret_cast<float*>(data_) = value;
  }